

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall
CTPNArglist::gen_code_arglist(CTPNArglist *this,int *varargs,CTcNamedArgs *named_args)

{
  int iVar1;
  bool bVar2;
  CTPNArg *pCVar3;
  ulong intval;
  
  intval = 0;
  *varargs = 0;
  named_args->cnt = 0;
  named_args->args = this;
  pCVar3 = (this->super_CTPNArglistBase).list_;
  if (pCVar3 != (CTPNArg *)0x0) {
    do {
      if (((pCVar3->super_CTPNArgBase).field_0x40 & 1) == 0) {
        if ((pCVar3->super_CTPNArgBase).name_.typ_ == TOKT_INVALID) {
          intval = (ulong)((int)intval + 1);
        }
        else {
          named_args->cnt = named_args->cnt + 1;
        }
      }
      else {
        *varargs = 1;
      }
      pCVar3 = (pCVar3->super_CTPNArgBase).next_arg_;
    } while (pCVar3 != (CTPNArg *)0x0);
    intval = (ulong)(int)intval;
  }
  pCVar3 = (this->super_CTPNArglistBase).list_;
  if (pCVar3 != (CTPNArg *)0x0 && named_args->cnt != 0) {
    do {
      if ((pCVar3->super_CTPNArgBase).name_.typ_ != TOKT_INVALID) {
        (**(pCVar3->super_CTPNArgBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)
                  (pCVar3,0,0);
      }
      pCVar3 = (pCVar3->super_CTPNArgBase).next_arg_;
    } while (pCVar3 != (CTPNArg *)0x0);
  }
  pCVar3 = (this->super_CTPNArglistBase).list_;
  if (pCVar3 != (CTPNArg *)0x0) {
    bVar2 = false;
    do {
      if ((pCVar3->super_CTPNArgBase).name_.typ_ == TOKT_INVALID) {
        iVar1 = G_cg->sp_depth_;
        if (!bVar2 && ((pCVar3->super_CTPNArgBase).field_0x40 & 1) != 0) {
          CTPNConst::s_gen_code_int(intval);
          G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
          bVar2 = true;
        }
        (**(pCVar3->super_CTPNArgBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)
                  (pCVar3,0,0);
        if ((bVar2) && (((pCVar3->super_CTPNArgBase).field_0x40 & 1) == 0)) {
          CTcGenTarg::write_op(G_cg,0x8d);
        }
        if (G_cg->sp_depth_ <= iVar1) {
          CTcTokenizer::log_error(0x2d11);
        }
      }
      pCVar3 = (pCVar3->super_CTPNArgBase).next_arg_;
    } while (pCVar3 != (CTPNArg *)0x0);
  }
  return;
}

Assistant:

void CTPNArglist::gen_code_arglist(int *varargs, CTcNamedArgs &named_args)
{
    CTPNArg *arg;
    int i;
    int fixed_cnt;
    int pushed_varargs_counter;

    /* 
     *   scan the argument list for varargs - if we have any, we must
     *   treat all of them as varargs 
     */
    for (*varargs = FALSE, fixed_cnt = named_args.cnt = 0,
         named_args.args = this, arg = get_arg_list_head() ;
         arg != 0 ;
         arg = arg->get_next_arg())
    {
        /* if this is a varargs argument, we have varargs */
        if (arg->is_varargs())
        {
            /* note it */
            *varargs = TRUE;
        }
        else if (arg->is_named_param())
        {
            /* count the named argument */
            named_args.cnt += 1;
        }
        else
        {
            /* count another fixed positional argument */
            ++fixed_cnt;
        }
    }

    /*
     *   If we have named arguments, push them ahead of the position
     *   arguments.  
     */
    if (named_args.cnt != 0)
    {
        /* 
         *   Run through the argument list again, evaluating only named
         *   arguments on this pass.
         */
        for (i = argc_, arg = get_arg_list_head() ; arg != 0 ;
             arg = arg->get_next_arg(), --i)
        {
            /* if it's a named argument, push it */
            if (arg->is_named_param())
                arg->gen_code(FALSE, FALSE);
        }
    }

    /* 
     *   Push each positional argument in the list.  The arguments on the
     *   stack go in right-to-left order.  The parser builds the internal
     *   list of argument expressions in reverse order, so we must merely
     *   follow the list from head to tail.
     *   
     *   We need each argument value to be pushed (hence discard = false),
     *   and we need the assignable value of each argument expression (hence
     *   for_condition = false).  
     */
    for (pushed_varargs_counter = FALSE, i = argc_,
         arg = get_arg_list_head() ; arg != 0 ;
         arg = arg->get_next_arg(), --i)
    {
        int depth;

        /* skip named arguments on this pass */
        if (arg->is_named_param())
            continue;

        /* note the stack depth before generating the value */
        depth = G_cg->get_sp_depth();

        /* 
         *   check for varargs - if this is first varargs argument, push
         *   the counter placeholder 
         */
        if (arg->is_varargs() && !pushed_varargs_counter)
        {
            /* 
             *   write code to push the fixed argument count - we can use
             *   this as a starting point, since we always know we have
             *   this many argument to start with; we'll dynamically add
             *   in the variable count at run-time 
             */
            CTPNConst::s_gen_code_int(fixed_cnt);
            
            /* note that we've pushed the counter */
            pushed_varargs_counter = TRUE;

            /* 
             *   we will take the extra value off when we evaluate the
             *   varargs counter, so simply count it as removed now 
             */
            G_cg->note_pop();
        }

        /* generate the argument's code */
        arg->gen_code(FALSE, FALSE);

        /* 
         *   if we've pushed the variable argument counter value onto the
         *   stack, and this a fixed argument, swap the top two stack
         *   elements to get the argument counter back to the top of the
         *   stack; if this is a varargs argument there's no need, since
         *   it will have taken care of this 
         */
        if (pushed_varargs_counter && !arg->is_varargs())
            G_cg->write_op(OPC_SWAP);

        /* ensure that it generated something */
        if (G_cg->get_sp_depth() <= depth)
            G_tok->log_error(TCERR_ARG_EXPR_HAS_NO_VAL, i);
    }
}